

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O2

_Bool evaluate_block_definition(Scope *scope,BlockDefinition *block_definition)

{
  char *name;
  _Bool _Var1;
  ulong uVar2;
  Scope *scope_00;
  Value *pVVar3;
  GeneratorValue *value;
  GeneratorValue *generator_value;
  size_t i;
  ulong uVar4;
  Expression *expression;
  _Bool _Var5;
  _Bool _Var6;
  ElseBlockDefinition *else_block_definition;
  
  _Var6 = false;
LAB_001078f0:
  _Var5 = _Var6;
  _Var6 = true;
  switch(block_definition->block_definition_type) {
  case BlockDefinitionTypeIfBlock:
    scope_00 = new_scope(scope,*(Block **)(block_definition + 2),ScopeTypeNormalScope);
    if (*(Expression **)(block_definition + 4) != (Expression *)0x0) {
      pVVar3 = evaluate_expression(scope_00,*(Expression **)(block_definition + 4));
      free_value(pVVar3);
    }
    value = (GeneratorValue *)evaluate_expression(scope_00,*(Expression **)(block_definition + 6));
    _Var6 = convert_to_bool((Value *)value);
    if (_Var6) {
      pVVar3 = evaluate_scope(scope_00);
      free_value(pVVar3);
    }
    goto LAB_001079d3;
  case BlockDefinitionTypeElseBlock:
    scope_00 = new_scope(scope,*(Block **)(block_definition + 2),ScopeTypeNormalScope);
    pVVar3 = evaluate_scope(scope_00);
    free_value(pVVar3);
    goto LAB_00107a8e;
  case BlockDefinitionTypeIfElseGroupBlock:
    for (uVar4 = 0; uVar2 = *(ulong *)(block_definition + 2), uVar4 < uVar2; uVar4 = uVar4 + 1) {
      _Var1 = evaluate_block_definition
                        (scope,*(BlockDefinition **)(*(long *)(block_definition + 4) + uVar4 * 8));
      if (_Var1) {
        uVar2 = *(ulong *)(block_definition + 2);
        break;
      }
    }
    if (uVar2 == uVar4) goto code_r0x0010793f;
    break;
  case BlockDefinitionTypeForBlock:
    scope_00 = new_scope(scope,*(Block **)(block_definition + 2),ScopeTypeNormalScope);
    if (*(Expression **)(block_definition + 4) != (Expression *)0x0) {
      pVVar3 = evaluate_expression(scope_00,*(Expression **)(block_definition + 4));
      free_value(pVVar3);
    }
    expression = *(Expression **)(block_definition + 6);
    if ((expression->expression_type == ExpressionTypeInfixExpression) &&
       (expression[1].expression_type == 0x1a)) {
      name = *(char **)(*(long *)(expression[1].literal + 2) + 8);
      value = (GeneratorValue *)evaluate_expression(scope_00,*(Expression **)(expression + 2));
      if ((value->value).value_type == ValueTypeGeneratorValue) {
        generator_value = value;
        value = (GeneratorValue *)0x0;
      }
      else {
        generator_value = (GeneratorValue *)convert_to_generator_value((Value *)value);
      }
      while (pVVar3 = fetch_value_from_generator_value(generator_value),
            pVVar3->value_type != ValueTypeNullValue) {
        scope_set_variable(scope_00,ValueTypeNullValue,name,pVVar3,0);
        pVVar3 = evaluate_scope(scope_00);
        free_value(pVVar3);
      }
      free_value(&generator_value->value);
      _Var6 = true;
      if (value == (GeneratorValue *)0x0) goto LAB_00107a91;
LAB_001079d3:
      free_value(&value->value);
    }
    else {
      while( true ) {
        pVVar3 = evaluate_expression(scope_00,expression);
        _Var6 = convert_to_bool(pVVar3);
        free_value(pVVar3);
        if (!_Var6) break;
        pVVar3 = evaluate_scope(scope_00);
        free_value(pVVar3);
        if (*(Expression **)(block_definition + 8) != (Expression *)0x0) {
          pVVar3 = evaluate_expression(scope_00,*(Expression **)(block_definition + 8));
          free_value(pVVar3);
        }
        expression = *(Expression **)(block_definition + 6);
      }
LAB_00107a8e:
      _Var6 = true;
    }
LAB_00107a91:
    free_scope(scope_00);
  }
  goto switchD_0010790c_default;
code_r0x0010793f:
  block_definition = *(BlockDefinition **)(block_definition + 6);
  _Var6 = true;
  if (block_definition == (BlockDefinition *)0x0) {
switchD_0010790c_default:
    return (_Bool)(_Var5 | _Var6);
  }
  goto LAB_001078f0;
}

Assistant:

bool evaluate_block_definition(Scope *scope, BlockDefinition *block_definition) {
  Scope *block_scope = NULL;

  switch (block_definition->block_definition_type) {
    case BlockDefinitionTypeIfElseGroupBlock: {
      IfElseGroupBlockDefinition *if_else_group_block_definition = (IfElseGroupBlockDefinition *) block_definition;

      size_t i;

      for (i = 0; i < if_else_group_block_definition->if_block_definitions_length; i++) {
        if (evaluate_block_definition(scope, (BlockDefinition *) if_else_group_block_definition->if_block_definitions[i])) {
          break;
        }
      }

      if (i == if_else_group_block_definition->if_block_definitions_length && if_else_group_block_definition->else_block_definition != NULL) {
        evaluate_block_definition(scope, (BlockDefinition *) if_else_group_block_definition->else_block_definition);
      }

      return true;
    }

    case BlockDefinitionTypeIfBlock: {
      IfBlockDefinition *if_block_definition = (IfBlockDefinition *) block_definition;

      block_scope = new_scope(scope, if_block_definition->block, ScopeTypeNormalScope);

      if (if_block_definition->pre_expression != NULL) {
        free_value(evaluate_expression(block_scope, if_block_definition->pre_expression));
      }

      Value *condition_value = evaluate_expression(block_scope, if_block_definition->condition);
      bool condition = convert_to_bool(condition_value);

      if (condition) {
        free_value(evaluate_scope(block_scope));
      }

      free_value(condition_value);
      free_scope(block_scope);

      return condition;
    }

    case BlockDefinitionTypeElseBlock: {
      ElseBlockDefinition *else_block_definition = (ElseBlockDefinition *) block_definition;

      block_scope = new_scope(scope, else_block_definition->block, ScopeTypeNormalScope);

      free_value(evaluate_scope(block_scope));
      free_scope(block_scope);

      return true;
    }

    case BlockDefinitionTypeForBlock: {
      ForBlockDefinition *for_block_definition = (ForBlockDefinition *) block_definition;

      block_scope = new_scope(scope, for_block_definition->block, ScopeTypeNormalScope);

      if (for_block_definition->pre_expression != NULL) {
        free_value(evaluate_expression(block_scope, for_block_definition->pre_expression));
      }

      if (for_block_definition->condition->expression_type == ExpressionTypeInfixExpression && (((InfixExpression *) for_block_definition->condition)->operator == IN_OP)) {
        InfixExpression *in_infix_expression = (InfixExpression *) for_block_definition->condition;

        char *identifier = ((StringLiteral *) in_infix_expression->left_expression->literal)->string_literal;

        Value *right_value = evaluate_expression(block_scope, in_infix_expression->right_expression);
        GeneratorValue *generator_value;

        if (right_value->value_type == ValueTypeGeneratorValue) {
          generator_value = (GeneratorValue *) right_value;
          right_value = NULL;
        }
        else {
          generator_value = (GeneratorValue *) convert_to_generator_value(right_value);
        }

        Value *for_block_value;

        while ((for_block_value = fetch_value_from_generator_value(generator_value))->value_type != ValueTypeNullValue) {
          scope_set_variable(block_scope, ValueTypeNullValue, identifier, for_block_value, false);

          free_value(evaluate_scope(block_scope));
        }

        free_value((Value *) generator_value);
        if (right_value != NULL) free_value(right_value);
        free_scope(block_scope);
      }
      else {
        Value *condition_value = evaluate_expression(block_scope, for_block_definition->condition);

        while (convert_to_bool(condition_value)) {
          free_value(condition_value);

          Value *value = evaluate_scope(block_scope);
          free_value(value);

          if (for_block_definition->post_expression != NULL) {
            free_value(evaluate_expression(block_scope, for_block_definition->post_expression));
          }

          condition_value = evaluate_expression(block_scope, for_block_definition->condition);
        }

        free_value(condition_value);
        free_scope(block_scope);
      }

      return true;
    }

    default: {
      return true;
    }
  }
}